

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O2

sunrealtype LBasisD(ARKInterp I,int j,sunrealtype t)

{
  double dVar1;
  uint uVar2;
  void *pvVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  
  pvVar3 = I->content;
  uVar2 = *(uint *)((long)pvVar3 + 0x18);
  uVar4 = 0;
  uVar5 = 0;
  if (0 < (int)uVar2) {
    uVar5 = (ulong)uVar2;
  }
  dVar7 = 0.0;
  for (; uVar4 != uVar5; uVar4 = uVar4 + 1) {
    if (uVar4 != (uint)j) {
      dVar8 = 1.0;
      for (uVar6 = 0; uVar2 != uVar6; uVar6 = uVar6 + 1) {
        if (uVar4 != uVar6 && (uint)j != uVar6) {
          dVar1 = *(double *)(*(long *)((long)pvVar3 + 0x10) + uVar6 * 8);
          dVar8 = dVar8 * ((t - dVar1) /
                          (*(double *)(*(long *)((long)pvVar3 + 0x10) + (long)j * 8) - dVar1));
        }
      }
      dVar7 = dVar7 + dVar8 / (*(double *)(*(long *)((long)pvVar3 + 0x10) + (long)j * 8) -
                              *(double *)(*(long *)((long)pvVar3 + 0x10) + uVar4 * 8));
    }
  }
  return dVar7;
}

Assistant:

sunrealtype LBasisD(ARKInterp I, int j, sunrealtype t)
{
  int i, k;
  sunrealtype p, q;
  p = ZERO;
  for (i = 0; i < LINT_NHIST(I); i++)
  {
    if (i == j) { continue; }
    q = ONE;
    for (k = 0; k < LINT_NHIST(I); k++)
    {
      if (k == j) { continue; }
      if (k == i) { continue; }
      q *= (t - LINT_TJ(I, k)) / (LINT_TJ(I, j) - LINT_TJ(I, k));
    }
    p += q / (LINT_TJ(I, j) - LINT_TJ(I, i));
  }

  return (p);
}